

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionSet::parallelReduce(SelectionSet *__return_storage_ptr__,SelectionSet *this)

{
  long lVar1;
  _Bvector_base<std::allocator<bool>_> _Stack_48;
  
  SelectionSet(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 0xf0; lVar1 = lVar1 + 0x28) {
    OpenMDBitSet::parallelReduce
              ((OpenMDBitSet *)&_Stack_48,
               (OpenMDBitSet *)
               ((long)&(((this->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1));
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((__return_storage_ptr__->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1),
               (vector<bool,_std::allocator<bool>_> *)&_Stack_48);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&_Stack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionSet::parallelReduce() {
    SelectionSet result;
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].parallelReduce();

    return result;
  }